

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_Perseus.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  undefined1 *puVar1;
  DecPOMDPDiscreteInterface *pDVar2;
  NullPlanner *this;
  PerseusBGPlanner *this_00;
  PerseusPOMDPPlanner *this_01;
  long *plVar3;
  ostream *poVar4;
  undefined8 *puVar5;
  long *plVar6;
  int iVar7;
  string *psVar8;
  PlanningUnitMADPDiscreteParameters params;
  BeliefSet B;
  QAVParameters qavParams;
  Arguments args;
  PlanningUnitMADPDiscreteParameters local_2d9 [7];
  undefined1 local_2d2;
  undefined1 local_2d0 [32];
  undefined1 local_2b0 [16];
  double local_2a0 [2];
  undefined1 local_290 [144];
  BGIP_Solver_t local_200;
  double local_1f8;
  char local_1ec;
  PerseusBackupType local_178;
  BGBackupType local_174;
  int local_170;
  int local_168;
  int local_150;
  int local_134;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70 [4];
  
  ArgumentHandlers::Arguments::Arguments((Arguments *)(local_290 + 0x28));
  argp_parse(ArgumentHandlers::theArgpStruc,argc,argv,0,0,local_290 + 0x28);
  if (local_1ec == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Perseus requires an infinite-horizon setting (use --inf)",0x38
              );
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
    std::ostream::put(-0x10);
    iVar7 = 1;
    std::ostream::flush();
  }
  else {
    Perseus::ProcessArguments((Arguments *)local_290);
    pDVar2 = (DecPOMDPDiscreteInterface *)
             ArgumentUtils::GetDecPOMDPDiscreteInterfaceFromArgs((Arguments *)(local_290 + 0x28));
    if ((local_1f8 != -1.0) || (NAN(local_1f8))) {
      (**(code **)(*(long *)(pDVar2 + *(long *)(*(long *)pDVar2 + -0xb0)) + 0x68))
                (pDVar2 + *(long *)(*(long *)pDVar2 + -0xb0));
    }
    PlanningUnitMADPDiscreteParameters::PlanningUnitMADPDiscreteParameters(local_2d9);
    PlanningUnitMADPDiscreteParameters::SetComputeAll(SUB81(local_2d9,0));
    local_2d2 = local_200 != BFS;
    this = (NullPlanner *)operator_new(0x338);
    NullPlanner::NullPlanner(this,999999,pDVar2,local_2d9);
    if (local_150 == 0) {
      this_01 = (PerseusPOMDPPlanner *)operator_new(0x200);
      PerseusPOMDPPlanner::PerseusPOMDPPlanner(this_01,(PlanningUnitDecPOMDPDiscrete *)this);
      psVar8 = (string *)(this_01 + 8);
    }
    else {
      if (local_150 != 1) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
        *puVar5 = &PTR__E_00105d40;
        puVar5[1] = puVar5 + 3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(puVar5 + 1),"PerseusBackupType is unknown","");
        __cxa_throw(puVar5,&E::typeinfo,E::~E);
      }
      this_00 = (PerseusBGPlanner *)operator_new(0x218);
      PerseusBGPlanner::PerseusBGPlanner
                (this_00,(PlanningUnitDecPOMDPDiscrete *)this,(QAVParameters *)local_290);
      psVar8 = (string *)(this_00 + 0x18);
    }
    *(undefined4 *)(psVar8 + 0x10) = local_290._40_4_;
    if (local_178 != POMDP) {
      *(PerseusBackupType *)(psVar8 + 8) = local_178;
    }
    if (local_170 != 0) {
      psVar8[0x15] = (string)0x1;
    }
    if (local_174 != EXHAUSTIVE_ONLYKEEPMAX) {
      psVar8[0x14] = (string)0x1;
    }
    Perseus::BackupTypeToString_abi_cxx11_((QAVParameters *)local_2b0);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_2b0,0,(char *)0x0,0x104164);
    puVar1 = local_2d0 + 0x10;
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_2d0._16_8_ = *plVar6;
      local_2d0._24_8_ = plVar3[3];
      local_2d0._0_8_ = puVar1;
    }
    else {
      local_2d0._16_8_ = *plVar6;
      local_2d0._0_8_ = (long *)*plVar3;
    }
    local_2d0._8_8_ = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    Perseus::SetIdentification(psVar8);
    if ((undefined1 *)local_2d0._0_8_ != puVar1) {
      operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
    }
    if ((double *)local_2b0._0_8_ != local_2a0) {
      operator_delete((void *)local_2b0._0_8_,(long)local_2a0[0] + 1);
    }
    local_2b0._0_8_ = local_2a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"POMDP","");
    directories::MADPGetResultsFilename
              ((string *)local_2d0,(MultiAgentDecisionProcessInterface *)local_2b0,
               (Arguments *)(pDVar2 + *(long *)(*(long *)pDVar2 + -0x40)));
    Perseus::SetResultsFilename(psVar8);
    if ((undefined1 *)local_2d0._0_8_ != puVar1) {
      operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
    }
    if ((double *)local_2b0._0_8_ != local_2a0) {
      operator_delete((void *)local_2b0._0_8_,(long)local_2a0[0] + 1);
    }
    if (-1 < (int)local_290._40_4_) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Sampling ",9);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_168);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," beliefs",8);
    }
    std::ostream::flush();
    AlphaVectorPlanning::SampleBeliefs((Arguments *)local_2d0);
    PerseusStationary::SetBeliefSet((vector *)psVar8);
    if (-1 < (int)local_290._40_4_) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,".",1);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
      std::ostream::put(-0x10);
      std::ostream::flush();
    }
    if (local_134 != 0) {
      psVar8[0x8a] = (string)0x1;
    }
    psVar8[0x8b] = (string)0x1;
    (**(code **)(*(long *)psVar8 + 0x68))(psVar8);
    if (-1 < (int)local_290._40_4_) {
      TimedAlgorithm::PrintTimersSummary();
    }
    if ((undefined1 *)local_2d0._0_8_ != (undefined1 *)0x0) {
      operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ - local_2d0._0_8_);
    }
    PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters(local_2d9);
    iVar7 = 0;
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0]._M_allocated_capacity + 1);
  }
  if (iVar7 == 0) {
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int main(int argc, char **argv)
{
    try
    {

    ArgumentHandlers::Arguments args;
    argp_parse (&ArgumentHandlers::theArgpStruc, argc, argv, 0, 0, &args);

    if(!args.infiniteHorizon)
    {
        cout << "Perseus requires an infinite-horizon setting (use --inf)" << endl;
        return(1);
    }

    size_t horizon;
    if(args.infiniteHorizon)
        horizon=MAXHORIZON;
    else
        horizon=args.horizon;
    
    QAVParameters qavParams=Perseus::ProcessArguments(args);

    DecPOMDPDiscreteInterface* decpomdp;
    decpomdp = GetDecPOMDPDiscreteInterfaceFromArgs(args);

    /*
    if(args.isTOI)
    {
        // necessary for running Perseus
        if(args.sparse)
        {
            cout << "Creating centralized sparse models"; cout.flush();
            dynamic_cast<TOIDecPOMDPDiscrete*>(decpomdp)->CreateCentralizedSparseModels();
            cout << "." << endl;
        }
        else
        {
            cout << "Creating centralized full models"; cout.flush();
            dynamic_cast<TOIDecPOMDPDiscrete*>(decpomdp)->CreateCentralizedFullModels();
            cout << "." << endl;
        }
    }*/

    if(args.discount!=-1)
        decpomdp->SetDiscount(args.discount);

    PlanningUnitMADPDiscreteParameters params;
    params.SetComputeAll(false);
    if(args.sparse)
        params.SetUseSparseJointBeliefs(true);
    else
        params.SetUseSparseJointBeliefs(false);
    NullPlanner *np=new NullPlanner(horizon, decpomdp, &params);
    
    Perseus *P;
    PerseusStationary *PS=0;
    switch(args.backup)
    {
    case POMDP:
        PS=new PerseusPOMDPPlanner(np);
        break;
    case BG:
        PS=new PerseusBGPlanner(np,qavParams);
        break;
    default:
        throw(E("PerseusBackupType is unknown"));
    }
    P=PS;

    P->SetVerbose(args.verbose);
    if(args.minimumNrIterations)
        P->SetMinimumNumberOfIterations(args.minimumNrIterations);
    if(args.initializeWithZero)
        P->SetInitializeWithZero(true);
    if(args.initializeWithImmediateReward)
        P->SetInitializeWithImmediateReward(true);
    P->SetIdentification("Perseus" + Perseus::BackupTypeToString(qavParams));
    P->SetResultsFilename(directories::MADPGetResultsFilename("POMDP",
                                                              *decpomdp,args));
    if(args.verbose >= 0)
        cout << "Sampling " << args.nrBeliefs << " beliefs"; cout.flush();

    BeliefSet B=P->SampleBeliefs(args);

    PS->SetBeliefSet(B);

    if(args.verbose >= 0)
        cout << "." << endl;

    if(args.computeVectorForEachBelief)
        P->SetComputeVectorForEachBelief(true);
    P->SetDryrun(true);
    P->Plan();

    if(args.verbose >= 0)
        P->PrintTimersSummary();
    }
    catch(E& e){ e.Print(); }

    return(0);
}